

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_rate.c
# Opt level: O0

double * inform_local_entropy_rate
                   (int *series,size_t n,size_t m,int b,size_t k,double *er,inform_error *err)

{
  _Bool _Var1;
  ulong uVar2;
  ulong uVar3;
  void *__ptr;
  int *state_00;
  bool bVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ulong local_d0;
  size_t i;
  double h;
  double s;
  int *history;
  int *state;
  int *state_data;
  inform_dist histories;
  inform_dist states;
  uint32_t *histogram_data;
  size_t total_size;
  size_t histories_size;
  size_t states_size;
  _Bool allocate_er;
  size_t N;
  double *er_local;
  size_t k_local;
  int b_local;
  size_t m_local;
  size_t n_local;
  int *series_local;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  if (_Var1) {
    series_local = (int *)0x0;
  }
  else {
    uVar2 = n * (m - k);
    bVar4 = er == (double *)0x0;
    N = (size_t)er;
    if ((bVar4) && (N = (size_t)malloc(uVar2 * 8), (void *)N == (void *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x0;
    }
    else {
      auVar6._8_4_ = (int)(k >> 0x20);
      auVar6._0_8_ = k;
      auVar6._12_4_ = 0x45300000;
      dVar5 = pow((double)b,
                  (auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
      dVar5 = (double)b * dVar5;
      uVar3 = (ulong)dVar5;
      uVar3 = uVar3 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
      __ptr = calloc(uVar3 + (long)(uVar3 / (ulong)(long)b),4);
      if (__ptr == (void *)0x0) {
        if (bVar4) {
          free((void *)N);
        }
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        series_local = (int *)0x0;
      }
      else {
        state_data = (int *)((long)__ptr + uVar3 * 4);
        histories.histogram = (uint32_t *)(uVar3 / (ulong)(long)b);
        histories.size = uVar2;
        histories.counts = (uint64_t)__ptr;
        state_00 = (int *)malloc(uVar2 * 0x10);
        if (state_00 == (int *)0x0) {
          if (bVar4) {
            free((void *)N);
          }
          free(__ptr);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          series_local = (int *)0x0;
        }
        else {
          accumulate_local_observations
                    (series,n,m,b,k,(inform_dist *)&histories.counts,(inform_dist *)&state_data,
                     state_00,state_00 + uVar2);
          for (local_d0 = 0; local_d0 < uVar2; local_d0 = local_d0 + 1) {
            dVar5 = log2((double)(uint)state_data[(state_00 + uVar2)[local_d0]] /
                         (double)*(uint *)(histories.counts + (long)state_00[local_d0] * 4));
            *(double *)(N + local_d0 * 8) = dVar5;
          }
          free(state_00);
          free(__ptr);
          series_local = (int *)N;
        }
      }
    }
  }
  return (double *)series_local;
}

Assistant:

double *inform_local_entropy_rate(int const *series, size_t n, size_t m, int b,
    size_t k, double *er, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate_er = (er == NULL);
    if (allocate_er)
    {
        er = malloc(N * sizeof(double));
        if (er == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) (b * pow((double) b, (double) k));
    size_t const histories_size = states_size / b;
    size_t const total_size = states_size + histories_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        if (allocate_er) free(er);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states    = { histogram_data, states_size, N };
    inform_dist histories = { histogram_data + states_size, histories_size, N };


    int *state_data = malloc(2 * N * sizeof(uint64_t));
    if (state_data == NULL)
    {
        if (allocate_er) free(er);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state = state_data;
    int *history = state + N;

    accumulate_local_observations(series, n, m, b, k, &states, &histories,
        state, history);

    double s, h;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        h = histories.histogram[history[i]];
        er[i] = log2(h/s);
    }

    free(state_data);
    free(histogram_data);

    return er;
}